

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls12_check_peer_sigalg
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,uint16_t sigalg,EVP_PKEY *pkey)

{
  bool bVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  uint16_t local_2a;
  
  sVar2 = (hs->config->verify_sigalgs).size_;
  if (sVar2 == 0) {
    puVar4 = &kVerifySignatureAlgorithms;
    sVar2 = 9;
  }
  else {
    puVar4 = (hs->config->verify_sigalgs).data_;
  }
  local_2a = sigalg;
  puVar3 = std::
           __find_if<unsigned_short_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                     (puVar4,puVar4 + sVar2,&local_2a);
  if ((puVar3 != puVar4 + sVar2) &&
     (bVar1 = ssl_pkey_supports_algorithm(hs->ssl,pkey,local_2a,true), bVar1)) {
    return true;
  }
  ERR_put_error(0x10,0,0xf5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x157);
  *out_alert = '/';
  return false;
}

Assistant:

bool tls12_check_peer_sigalg(const SSL_HANDSHAKE *hs, uint8_t *out_alert,
                             uint16_t sigalg, EVP_PKEY *pkey) {
  // The peer must have selected an algorithm that is consistent with its public
  // key, the TLS version, and what we advertised.
  Span<const uint16_t> sigalgs = tls12_get_verify_sigalgs(hs);
  if (std::find(sigalgs.begin(), sigalgs.end(), sigalg) == sigalgs.end() ||
      !ssl_pkey_supports_algorithm(hs->ssl, pkey, sigalg, /*is_verify=*/true)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_SIGNATURE_TYPE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}